

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

string * xsettingsd::StringPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  allocator<char> local_439;
  undefined4 local_438;
  undefined4 local_434;
  va_list argp;
  char local_418 [8];
  char buffer [1024];
  char *format_local;
  
  if (in_AL != '\0') {
    local_4d8 = in_XMM0_Qa;
    local_4c8 = in_XMM1_Qa;
    local_4b8 = in_XMM2_Qa;
    local_4a8 = in_XMM3_Qa;
    local_498 = in_XMM4_Qa;
    local_488 = in_XMM5_Qa;
    local_478 = in_XMM6_Qa;
    local_468 = in_XMM7_Qa;
  }
  argp[0].overflow_arg_area = local_508;
  argp[0]._0_8_ = &stack0x00000008;
  local_434 = 0x30;
  local_438 = 0x10;
  local_4f8 = in_RDX;
  local_4f0 = in_RCX;
  local_4e8 = in_R8;
  local_4e0 = in_R9;
  buffer._1016_8_ = format;
  vsnprintf(local_418,0x400,format,&local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_418,&local_439);
  std::allocator<char>::~allocator(&local_439);
  return __return_storage_ptr__;
}

Assistant:

string StringPrintf(const char* format, ...) {
  char buffer[1024];
  va_list argp;
  va_start(argp, format);
  vsnprintf(buffer, sizeof(buffer), format, argp);
  va_end(argp);
  return string(buffer);
}